

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O3

void u32From(u32 *dest,void *src,size_t count)

{
  memMove(dest,src,count);
  if ((count & 3) != 0) {
    memSet((void *)((long)dest + count),'\0',4 - (count & 3));
    return;
  }
  return;
}

Assistant:

void u32From(u32 dest[], const void* src, size_t count)
{
	ASSERT(memIsValid(src, count));
	ASSERT(memIsValid(dest, ((count + 3) / 4) * 4));
	memMove(dest, src, count);
	if (count % 4)
		memSetZero((octet*)dest + count, 4 - count % 4);
#if (OCTET_ORDER == BIG_ENDIAN)
	for (count = (count + 3) / 4; count--;)
		dest[count] = u32Rev(dest[count]);
#endif // OCTET_ORDER
}